

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O2

void __thiscall
xmrig::Workers<xmrig::CudaLaunchData>::start
          (Workers<xmrig::CudaLaunchData> *this,
          vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *data)

{
  pointer pCVar1;
  IBackend *pIVar2;
  pointer ppTVar3;
  CudaDevice *pCVar4;
  int64_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  undefined4 uVar11;
  Hashrate *this_00;
  CudaLaunchData *item;
  pointer pCVar12;
  pointer ppTVar13;
  Thread<xmrig::CudaLaunchData> *local_30;
  
  pCVar1 = (data->super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar12 = (data->
                 super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>).
                 _M_impl.super__Vector_impl_data._M_start; pCVar12 != pCVar1; pCVar12 = pCVar12 + 1)
  {
    local_30 = (Thread<xmrig::CudaLaunchData> *)operator_new(0x50);
    pIVar2 = this->d_ptr->backend;
    local_30->m_id =
         (long)(this->m_workers).
               super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->m_workers).
               super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    pCVar4 = pCVar12->device;
    iVar6 = (pCVar12->thread).m_blocks;
    iVar7 = (pCVar12->thread).m_threads;
    iVar5 = (pCVar12->thread).m_affinity;
    uVar8 = (pCVar12->thread).m_index;
    uVar9 = (pCVar12->thread).m_bfactor;
    uVar10 = (pCVar12->thread).m_bsleep;
    uVar11 = *(undefined4 *)&(pCVar12->thread).field_0x1c;
    (local_30->m_config).miner = pCVar12->miner;
    (local_30->m_config).device = pCVar4;
    (local_30->m_config).thread.m_blocks = iVar6;
    (local_30->m_config).thread.m_threads = iVar7;
    (local_30->m_config).thread.m_affinity = iVar5;
    (local_30->m_config).thread.m_index = uVar8;
    (local_30->m_config).thread.m_bfactor = uVar9;
    (local_30->m_config).thread.m_bsleep = uVar10;
    *(undefined4 *)&(local_30->m_config).thread.field_0x1c = uVar11;
    local_30->m_backend = pIVar2;
    local_30->m_worker = (IWorker *)0x0;
    (local_30->m_thread)._M_id._M_thread = 0;
    std::
    vector<xmrig::Thread<xmrig::CudaLaunchData>*,std::allocator<xmrig::Thread<xmrig::CudaLaunchData>*>>
    ::emplace_back<xmrig::Thread<xmrig::CudaLaunchData>*>
              ((vector<xmrig::Thread<xmrig::CudaLaunchData>*,std::allocator<xmrig::Thread<xmrig::CudaLaunchData>*>>
                *)this,&local_30);
  }
  this_00 = (Hashrate *)operator_new(0x20);
  Hashrate::Hashrate(this_00,(long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  this->d_ptr->hashrate = this_00;
  LOCK();
  DAT_001bde60 = DAT_001bde60 + 1;
  UNLOCK();
  ppTVar3 = (this->m_workers).
            super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar13 = (this->m_workers).
                  super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppTVar13 != ppTVar3;
      ppTVar13 = ppTVar13 + 1) {
    Thread<xmrig::CudaLaunchData>::start(*ppTVar13,onReady);
  }
  return;
}

Assistant:

void xmrig::Workers<T>::start(const std::vector<T> &data)
{
    for (const T &item : data) {
        m_workers.push_back(new Thread<T>(d_ptr->backend, m_workers.size(), item));
    }

    d_ptr->hashrate = new Hashrate(m_workers.size());
    Nonce::touch(T::backend());

    for (Thread<T> *worker : m_workers) {
        worker->start(Workers<T>::onReady);
    }
}